

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O3

bool ON_RemoveBezierSingAt0(int dim,int order,int cv_stride,double *cv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  
  lVar3 = (long)dim;
  if ((cv[lVar3] == 0.0) && (!NAN(cv[lVar3]))) {
    uVar6 = (ulong)(order - 1);
    iVar1 = order;
    iVar2 = -1;
    do {
      iVar10 = iVar2;
      iVar7 = iVar1;
      if (iVar7 < 3) {
        return false;
      }
      lVar4 = lVar3;
      while (lVar4 = lVar4 + -1, lVar4 != -1) {
        if (cv[lVar4] != 0.0) {
          return false;
        }
        if (NAN(cv[lVar4])) {
          return false;
        }
      }
      uVar9 = 0;
      pdVar11 = cv;
      do {
        uVar9 = uVar9 + 1;
        if (-1 < dim) {
          uVar5 = (ulong)(dim + 1);
          pdVar8 = pdVar11;
          do {
            *pdVar8 = (pdVar8[cv_stride] * (double)(iVar7 + -1)) / (double)(int)uVar9;
            pdVar8 = pdVar8 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        pdVar11 = pdVar11 + cv_stride;
      } while (uVar9 != uVar6);
      uVar6 = uVar6 - 1;
    } while ((cv[lVar3] == 0.0) && (iVar1 = iVar7 + -1, iVar2 = iVar10 + -1, !NAN(cv[lVar3])));
    if (iVar7 <= order) {
      do {
        ON_IncreaseBezierDegree(dim,true,order + iVar10,cv_stride,cv);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0);
    }
  }
  return true;
}

Assistant:

bool ON_RemoveBezierSingAt0(
                  int dim, 
                  int order, 
                  int cv_stride,
                  double* cv
                  )
{
  const int cvdim = dim+1;
  int j,k,ord0;
  ord0 = order;
  while(cv[dim] == 0.0) {
    order--; 
    if (order < 2)
      return false;
    j = dim; 
    while(j--) {
      if (cv[j] != 0.0) 
        return false;
    }
    for (j=0;  j<order;  j++) {
      for (k=0;  k<cvdim;  k++) 
        cv[j*cv_stride+k] = (order*cv[(j+1)*cv_stride+k])/(j+1);
    }
  }
  while (order < ord0)
    ON_IncreaseBezierDegree(dim,true,order++,cv_stride,cv);
  return true;
}